

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

CURLUPart part2id(char *part)

{
  int iVar1;
  char *part_local;
  
  iVar1 = strcmp("url",part);
  if (iVar1 == 0) {
    part_local._4_4_ = CURLUPART_URL;
  }
  else {
    iVar1 = strcmp("scheme",part);
    if (iVar1 == 0) {
      part_local._4_4_ = CURLUPART_SCHEME;
    }
    else {
      iVar1 = strcmp("user",part);
      if (iVar1 == 0) {
        part_local._4_4_ = CURLUPART_USER;
      }
      else {
        iVar1 = strcmp("password",part);
        if (iVar1 == 0) {
          part_local._4_4_ = CURLUPART_PASSWORD;
        }
        else {
          iVar1 = strcmp("options",part);
          if (iVar1 == 0) {
            part_local._4_4_ = CURLUPART_OPTIONS;
          }
          else {
            iVar1 = strcmp("host",part);
            if (iVar1 == 0) {
              part_local._4_4_ = CURLUPART_HOST;
            }
            else {
              iVar1 = strcmp("port",part);
              if (iVar1 == 0) {
                part_local._4_4_ = CURLUPART_PORT;
              }
              else {
                iVar1 = strcmp("path",part);
                if (iVar1 == 0) {
                  part_local._4_4_ = CURLUPART_PATH;
                }
                else {
                  iVar1 = strcmp("query",part);
                  if (iVar1 == 0) {
                    part_local._4_4_ = CURLUPART_QUERY;
                  }
                  else {
                    iVar1 = strcmp("fragment",part);
                    if (iVar1 == 0) {
                      part_local._4_4_ = CURLUPART_FRAGMENT;
                    }
                    else {
                      iVar1 = strcmp("zoneid",part);
                      if (iVar1 == 0) {
                        part_local._4_4_ = CURLUPART_ZONEID;
                      }
                      else {
                        part_local._4_4_ = 9999;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return part_local._4_4_;
}

Assistant:

static CURLUPart part2id(char *part)
{
  if(!strcmp("url", part))
    return CURLUPART_URL;
  if(!strcmp("scheme", part))
    return CURLUPART_SCHEME;
  if(!strcmp("user", part))
    return CURLUPART_USER;
  if(!strcmp("password", part))
    return CURLUPART_PASSWORD;
  if(!strcmp("options", part))
    return CURLUPART_OPTIONS;
  if(!strcmp("host", part))
    return CURLUPART_HOST;
  if(!strcmp("port", part))
    return CURLUPART_PORT;
  if(!strcmp("path", part))
    return CURLUPART_PATH;
  if(!strcmp("query", part))
    return CURLUPART_QUERY;
  if(!strcmp("fragment", part))
    return CURLUPART_FRAGMENT;
  if(!strcmp("zoneid", part))
    return CURLUPART_ZONEID;
  return 9999; /* bad input => bad output */
}